

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int file_type(char *name)

{
  FILE *__stream;
  __syscall_slong_t _Var1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_a8 [8];
  stat statbuf;
  char *name_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)name;
  iVar2 = stat(name,(stat *)local_a8);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    _Var1 = statbuf.__glibc_reserved[2];
    __stream = _stderr;
    if (*piVar3 != 2) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"%s: stat: %s\n",_Var1,pcVar4);
    }
    name_local._4_4_ = 0;
  }
  else if (((uint)statbuf.st_nlink & 0xf000) == 0x8000) {
    name_local._4_4_ = 1;
  }
  else if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
    name_local._4_4_ = 2;
  }
  else {
    name_local._4_4_ = 3;
  }
  return name_local._4_4_;
}

Assistant:

int file_type(const char *name)
{
    struct stat statbuf;

    if (stat(name, &statbuf) < 0) {
        if (errno != ENOENT)
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
        return FILE_TYPE_NONEXISTENT;
    }

    if (S_ISREG(statbuf.st_mode))
        return FILE_TYPE_FILE;

    if (S_ISDIR(statbuf.st_mode))
        return FILE_TYPE_DIRECTORY;

    return FILE_TYPE_WEIRD;
}